

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::SerializePartialToCodedStream
          (MessageLite *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Nullable<const_char_*> pcVar5;
  LogMessage *pLVar6;
  string_view sVar7;
  LogMessage local_40;
  ulong local_30;
  ulong v;
  
  iVar2 = (*this->_vptr_MessageLite[3])();
  v = CONCAT44(extraout_var,iVar2);
  if ((v & 0xffffffff80000000) == 0) {
    iVar2 = io::CodedOutputStream::ByteCount(output);
    iVar3 = (*this->_vptr_MessageLite[5])(this,output->cur_,output);
    output->cur_ = (uint8_t *)CONCAT44(extraout_var_00,iVar3);
    bVar1 = io::CodedOutputStream::HadError(output);
    if (!bVar1) {
      iVar3 = io::CodedOutputStream::ByteCount(output);
      if (v != (long)(iVar3 - iVar2)) {
        iVar4 = (*this->_vptr_MessageLite[3])(this);
        local_30 = CONCAT44(extraout_var_01,iVar4);
        local_40._0_8_ = v;
        pcVar5 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                           ((unsigned_long *)&local_40,&local_30,
                            "byte_size_before_serialization == byte_size_after_serialization");
        if (pcVar5 == (Nullable<const_char_*>)0x0) {
          local_40._0_8_ = (long)(iVar3 - iVar2);
          local_30 = v;
          pcVar5 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                             ((unsigned_long *)&local_40,&local_30,
                              "bytes_produced_by_serialization == byte_size_before_serialization");
          if (pcVar5 == (Nullable<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                       ,0xb0);
            absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&local_40,
                       (char (*) [53])"This shouldn\'t be called if all the sizes are equal.");
          }
          else {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                       ,0xab,pcVar5);
            pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (&local_40,
                                (char (*) [155])
                                "Byte size calculation and serialization were inconsistent.  This may indicate a bug in protocol buffers or it may be caused by concurrent modification of "
                               );
            sVar7 = GetTypeName(this);
            pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,sVar7);
            absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,(char (*) [2])0x2d97d4);
          }
        }
        else {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                     ,0xa8,pcVar5);
          sVar7 = GetTypeName(this);
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,sVar7);
          absl::lts_20250127::log_internal::LogMessage::operator<<
                    (pLVar6,(char (*) [49])" was modified concurrently during serialization.");
        }
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_40);
      }
    }
    bVar1 = !bVar1;
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x201);
    sVar7 = GetTypeName(this);
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,sVar7);
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar6,(char (*) [41])" exceeded maximum protobuf size of 2GB: ");
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,v);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_40);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool MessageLite::SerializePartialToCodedStream(
    io::CodedOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    ABSL_LOG(ERROR) << GetTypeName()
                    << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  int original_byte_count = output->ByteCount();
  SerializeWithCachedSizes(output);
  if (output->HadError()) {
    return false;
  }
  int final_byte_count = output->ByteCount();

  if (final_byte_count - original_byte_count != static_cast<int64_t>(size)) {
    ByteSizeConsistencyError(size, ByteSizeLong(),
                             final_byte_count - original_byte_count, *this);
  }

  return true;
}